

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc64ad.c
# Opt level: O1

int_t mc64bd_(int_t *n,int_t *ne,int_t *ip,int_t *irn,double *a,int *iperm,int_t *num,int_t *jperm,
             int_t *pr,int_t *q,int_t *l,double *d__)

{
  double dVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int_t *piVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  int_t *piVar10;
  int_t *piVar11;
  uint *pos0;
  uint uVar12;
  double *pdVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  double *pdVar18;
  long lVar19;
  int_t *piVar20;
  int *piVar21;
  int_t *piVar22;
  ulong uVar23;
  int_t *piVar24;
  int_t c__1;
  uint local_ec;
  uint local_e8;
  int local_e4;
  int local_e0;
  uint local_dc;
  uint *local_d8;
  int_t *local_d0;
  int_t *local_c8;
  uint local_bc;
  int *local_b8;
  int_t local_ac;
  int_t *local_a8;
  double *local_a0;
  double *local_98;
  int_t *local_90;
  int_t *local_88;
  int_t *local_80;
  int_t *local_78;
  ulong local_70;
  int local_64;
  ulong local_60;
  uint *local_58;
  double *local_50;
  int_t *local_48;
  ulong local_40;
  int_t *local_38;
  
  local_ac = 1;
  local_a8 = irn;
  piVar24 = (int_t *)dmach("Overflow");
  *num = 0;
  uVar14 = *n;
  if (0 < (int)uVar14) {
    lVar9 = 0;
    do {
      *(undefined4 *)((long)iperm + lVar9) = 0;
      *(undefined4 *)((long)jperm + lVar9) = 0;
      ne = (int_t *)(ulong)*(uint *)((long)ip + lVar9);
      *(uint *)((long)pr + lVar9) = *(uint *)((long)ip + lVar9);
      *(undefined8 *)((long)d__ + lVar9 * 2) = 0;
      lVar9 = lVar9 + 4;
    } while ((ulong)uVar14 << 2 != lVar9);
  }
  piVar20 = jperm + -1;
  uVar14 = *n;
  if (0 < (int)uVar14) {
    lVar9 = 1;
    do {
      iVar8 = ip[lVar9];
      lVar16 = (long)ip[lVar9 + -1];
      piVar22 = (int_t *)0xbff0000000000000;
      if (ip[lVar9 + -1] < iVar8) {
        do {
          uVar2 = local_a8[lVar16 + -1];
          dVar1 = a[lVar16 + -1];
          uVar23 = -(ulong)(-dVar1 <= dVar1);
          piVar10 = (int_t *)(~uVar23 & (ulong)-dVar1 | (ulong)dVar1 & uVar23);
          if (d__[(long)(int)uVar2 + -1] <= (double)piVar10 &&
              (double)piVar10 != d__[(long)(int)uVar2 + -1]) {
            d__[(long)(int)uVar2 + -1] = (double)piVar10;
          }
          if (piVar20[lVar9] == 0) {
            if ((double)piVar24 <= (double)piVar10) {
              piVar22 = piVar24;
              if (iperm[(long)(int)uVar2 + -1] == 0) {
                piVar20[lVar9] = uVar2;
                iperm[(long)(int)uVar2 + -1] = (int)lVar9;
                *num = *num + 1;
              }
            }
            else if ((double)piVar22 < (double)piVar10) {
              ne = (int_t *)(ulong)uVar2;
              piVar22 = piVar10;
            }
          }
          lVar16 = lVar16 + 1;
        } while (iVar8 != lVar16);
      }
      if ((((double)piVar22 != -1.0) || (NAN((double)piVar22))) &&
         ((double)piVar22 < (double)piVar24)) {
        iVar8 = (int)ne;
        piVar24 = piVar22;
        if (iperm[(long)iVar8 + -1] == 0) {
          iperm[(long)iVar8 + -1] = (int)lVar9;
          piVar20[lVar9] = iVar8;
          *num = *num + 1;
        }
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != (ulong)uVar14 + 1);
  }
  uVar14 = *n;
  if (0 < (int)uVar14) {
    uVar23 = 0;
    do {
      if (d__[uVar23] <= (double)piVar24) {
        piVar24 = (int_t *)d__[uVar23];
      }
      uVar23 = uVar23 + 1;
    } while (uVar14 != uVar23);
  }
  if (*num != uVar14) {
    piVar22 = pr + -1;
    if (0 < (int)uVar14) {
      local_c8 = local_a8 + -1;
      local_a0 = a + -1;
      lVar9 = 1;
      do {
        if (piVar20[lVar9] == 0) {
          iVar8 = ip[lVar9];
          lVar16 = (long)ip[lVar9 + -1];
          if (ip[lVar9 + -1] < iVar8) {
            do {
              iVar7 = local_a8[lVar16 + -1];
              dVar1 = a[lVar16 + -1];
              uVar23 = -(ulong)(-dVar1 <= dVar1);
              if ((double)piVar24 <= (double)(~uVar23 & (ulong)-dVar1 | (ulong)dVar1 & uVar23)) {
                iVar15 = iperm[(long)iVar7 + -1];
                lVar17 = (long)iVar15;
                if (lVar17 == 0) {
LAB_00111b39:
                  *num = *num + 1;
                  piVar20[lVar9] = iVar7;
                  iperm[(long)iVar7 + -1] = (int)lVar9;
                  piVar22[lVar9] = (int)lVar16 + 1;
                  break;
                }
                uVar2 = piVar22[lVar17];
                iVar3 = ip[lVar17];
                if ((int)uVar2 < iVar3) {
                  uVar12 = ~uVar2;
                  lVar19 = 0;
                  do {
                    iVar4 = local_c8[(int)uVar2 + lVar19];
                    if ((iperm[(long)iVar4 + -1] == 0) &&
                       (dVar1 = local_a0[(int)uVar2 + lVar19], uVar23 = -(ulong)(-dVar1 <= dVar1),
                       (double)piVar24 <= (double)(~uVar23 & (ulong)-dVar1 | (ulong)dVar1 & uVar23))
                       ) {
                      piVar20[lVar17] = iVar4;
                      iperm[(long)iVar4 + -1] = iVar15;
                      piVar22[lVar17] = -uVar12;
                      goto LAB_00111b39;
                    }
                    uVar12 = uVar12 - 1;
                    lVar19 = lVar19 + 1;
                  } while (iVar3 - uVar2 != (int)lVar19);
                  piVar22[lVar17] = iVar3;
                }
              }
              lVar16 = lVar16 + 1;
            } while (iVar8 != (int)lVar16);
          }
        }
        lVar9 = lVar9 + 1;
        local_98 = a;
      } while (lVar9 != (ulong)uVar14 + 1);
    }
    uVar14 = *n;
    if (*num != uVar14) {
      if ((int)uVar14 < 1) {
        uVar23 = 1;
      }
      else {
        uVar23 = 1;
        do {
          d__[uVar23 - 1] = -1.0;
          l[uVar23 - 1] = 0;
          uVar23 = uVar23 + 1;
        } while ((ulong)uVar14 + 1 != uVar23);
      }
      local_ec = (uint)uVar23;
      local_d8 = (uint *)n;
      local_b8 = iperm;
      local_90 = piVar22;
      local_80 = ip;
      local_78 = piVar20;
      if (0 < *n) {
        pdVar18 = (double *)(l + -1);
        uVar6 = (ulong)(uint)*n + 1;
        local_a8 = local_a8 + -1;
        pdVar13 = a + -1;
        local_38 = q + -2;
        piVar10 = (int_t *)0x1;
        local_a0 = pdVar18;
        local_98 = pdVar13;
        local_40 = uVar6;
        do {
          piVar5 = local_a8;
          if (piVar20[(long)piVar10] == 0) {
            local_e8 = 0;
            local_70 = (ulong)*local_d8;
            local_e4 = *local_d8 + 1;
            piVar22[(long)piVar10] = -1;
            iVar8 = local_80[(long)piVar10 - 1];
            uVar14 = 0;
            local_e0 = local_e4;
            local_60 = (ulong)piVar10;
            iVar7 = local_e4;
            if (iVar8 < local_80[(long)piVar10]) {
              piVar20 = (int_t *)(ulong)(uint)(local_80[(long)piVar10] - iVar8);
              lVar9 = 0;
              local_c8 = (int_t *)0xbff0000000000000;
              local_d0 = piVar20;
              local_88 = piVar24;
              do {
                uVar2 = piVar5[iVar8 + lVar9];
                uVar23 = (ulong)uVar2;
                dVar1 = pdVar13[iVar8 + lVar9];
                uVar6 = -(ulong)(-dVar1 <= dVar1);
                piVar22 = (int_t *)(~uVar6 & (ulong)-dVar1 | (ulong)dVar1 & uVar6);
                if ((double)local_c8 < (double)piVar22) {
                  if (iperm[(long)(int)uVar2 + -1] == 0) {
                    iVar15 = local_e0;
                    local_bc = uVar2;
                    if ((double)piVar24 <= (double)piVar22) goto LAB_001121cb;
                    local_dc = (uint)piVar10;
                    local_c8 = piVar22;
                  }
                  else {
                    d__[(long)(int)uVar2 + -1] = (double)piVar22;
                    if ((double)piVar24 <= (double)piVar22) {
                      lVar16 = (long)local_e4;
                      local_e4 = local_e4 + -1;
                      q[lVar16 + -2] = uVar2;
                    }
                    else {
                      uVar14 = uVar14 + 1;
                      l[(long)(int)uVar2 + -1] = uVar14;
                      local_ec = uVar2;
                      mc64dd_((int_t *)&local_ec,(int_t *)local_d8,q,d__,l,&local_ac);
                      piVar10 = (int_t *)local_60;
                      iperm = local_b8;
                      pdVar18 = local_a0;
                      piVar20 = local_d0;
                      piVar24 = local_88;
                      iVar7 = local_e0;
                    }
                    local_90[iperm[(long)(int)uVar2 + -1]] = (int_t)piVar10;
                  }
                }
                lVar9 = lVar9 + 1;
              } while ((int)piVar20 != (int)lVar9);
            }
            else {
              local_c8 = (int_t *)0xbff0000000000000;
            }
            iVar8 = *num;
            if (iVar8 < 1) {
              piVar22 = local_c8;
              iVar15 = local_e0;
              piVar10 = (int_t *)(ulong)local_dc;
            }
            else {
              lVar9 = (long)iVar7;
              local_e0 = ((int)local_70 - iVar8) + 1;
              uVar6 = 1;
              local_e8 = uVar14;
              local_64 = iVar8;
              do {
                iVar8 = (int)lVar9;
                local_70 = uVar6;
                if (local_e4 == iVar8) {
                  if (local_e8 == 0) break;
                  local_ec = *q;
                  uVar23 = (ulong)(int)local_ec;
                  local_d0 = (int_t *)d__[uVar23 - 1];
                  if ((double)local_d0 <= (double)local_c8) break;
                  uVar14 = *local_d8;
                  piVar24 = local_d0;
                  if (0 < (int)uVar14) {
                    piVar21 = local_38 + local_e4;
                    iVar8 = 1;
                    while( true ) {
                      iVar7 = iVar8;
                      mc64ed_((int_t *)&local_e8,(int_t *)local_d8,q,d__,l,&local_ac);
                      l[(long)(int)uVar23 + -1] = 0;
                      *piVar21 = (int)uVar23;
                      if (local_e8 == 0) break;
                      uVar23 = (ulong)*q;
                      if ((d__[uVar23 - 1] != (double)local_d0) ||
                         (NAN(d__[uVar23 - 1]) || NAN((double)local_d0))) break;
                      piVar21 = piVar21 + -1;
                      iVar8 = iVar7 + 1;
                      if ((int)uVar14 <= iVar7) break;
                    }
                    local_e4 = local_e4 - iVar7;
                    iperm = local_b8;
                    pdVar18 = local_a0;
                    piVar24 = local_d0;
                  }
                }
                piVar5 = local_a8;
                lVar16 = (long)q[lVar9 + -2];
                lVar9 = lVar9 + -1;
                piVar20 = (int_t *)d__[lVar16 + -1];
                *(int *)((long)pdVar18 + lVar16 * 4) = (int)lVar9;
                piVar11 = (int_t *)(long)iperm[lVar16 + -1];
                iVar8 = local_80[(long)piVar11];
                iVar7 = local_80[(long)piVar11 - 1];
                if (iVar7 < iVar8) {
                  pdVar13 = local_98 + iVar7;
                  lVar16 = 0;
                  local_d0 = piVar11;
                  local_88 = piVar24;
                  local_50 = pdVar13;
                  local_48 = piVar20;
                  do {
                    uVar2 = piVar5[iVar7 + lVar16];
                    uVar23 = (ulong)uVar2;
                    lVar17 = (long)(int)uVar2;
                    if (*(int *)((long)pdVar18 + lVar17 * 4) < lVar9) {
                      dVar1 = pdVar13[lVar16];
                      uVar6 = -(ulong)(-dVar1 <= dVar1);
                      piVar10 = (int_t *)(~uVar6 & (ulong)-dVar1 | (ulong)dVar1 & uVar6);
                      piVar22 = piVar20;
                      if ((double)piVar10 <= (double)piVar20) {
                        piVar22 = piVar10;
                      }
                      if ((double)local_c8 < (double)piVar22) {
                        if (iperm[lVar17 + -1] == 0) {
                          uVar14 = local_e8;
                          iVar15 = (int)lVar9;
                          piVar10 = local_d0;
                          local_bc = uVar2;
                          if ((double)piVar24 <= (double)piVar22) goto LAB_001121cb;
                          local_dc = (uint)piVar11;
                          local_c8 = piVar22;
                        }
                        else {
                          dVar1 = d__[lVar17 + -1];
                          if ((dVar1 < (double)piVar24) && (dVar1 < (double)piVar22)) {
                            pos0 = (uint *)((long)pdVar18 + lVar17 * 4);
                            d__[lVar17 + -1] = (double)piVar22;
                            local_ec = uVar2;
                            if ((double)piVar24 <= (double)piVar22) {
                              if ((dVar1 != -1.0) || (NAN(dVar1))) {
                                local_58 = pos0;
                                mc64fd_((int_t *)pos0,(int_t *)&local_e8,(int_t *)local_d8,q,d__,l,
                                        &local_ac);
                                pos0 = local_58;
                                pdVar13 = local_50;
                                pdVar18 = local_a0;
                                piVar24 = local_88;
                                piVar20 = local_48;
                              }
                              *pos0 = 0;
                              lVar19 = (long)local_e4;
                              local_e4 = local_e4 + -1;
                              q[lVar19 + -2] = uVar2;
                            }
                            else {
                              if ((dVar1 == -1.0) && (!NAN(dVar1))) {
                                local_e8 = local_e8 + 1;
                                *pos0 = local_e8;
                              }
                              mc64dd_((int_t *)&local_ec,(int_t *)local_d8,q,d__,l,&local_ac);
                              pdVar13 = local_50;
                              pdVar18 = local_a0;
                              piVar24 = local_88;
                              piVar20 = local_48;
                            }
                            local_90[local_b8[lVar17 + -1]] = (int_t)local_d0;
                            piVar11 = local_d0;
                            iperm = local_b8;
                          }
                        }
                      }
                    }
                    lVar16 = lVar16 + 1;
                  } while (iVar8 - iVar7 != (int)lVar16);
                }
                uVar6 = (ulong)((int)local_70 + 1);
                iVar8 = local_e0;
              } while ((int)local_70 != local_64);
              local_e0 = iVar8;
              piVar22 = local_c8;
              uVar14 = local_e8;
              iVar15 = local_e0;
              piVar10 = (int_t *)(ulong)local_dc;
            }
LAB_001121cb:
            local_d0 = piVar10;
            local_e0 = iVar15;
            local_e8 = uVar14;
            if (((double)piVar22 != -1.0) || (NAN((double)piVar22))) {
              iVar8 = *num;
              *num = iVar8 + 1;
              uVar23 = (ulong)local_bc;
              if (-2 < iVar8) {
                iVar8 = iVar8 + 2;
                if (iVar8 < 2) {
                  iVar8 = 1;
                }
                uVar6 = (ulong)local_d0 & 0xffffffff;
                uVar14 = local_bc;
                do {
                  uVar23 = (ulong)uVar14;
                  iVar7 = (int)uVar6;
                  uVar2 = local_78[iVar7];
                  local_78[iVar7] = uVar14;
                  iperm[(long)(int)uVar14 + -1] = iVar7;
                  uVar6 = (ulong)(uint)local_90[iVar7];
                  if (local_90[iVar7] == 0xffffffff) break;
                  uVar23 = (ulong)uVar2;
                  iVar8 = iVar8 + -1;
                  uVar14 = uVar2;
                } while (iVar8 != 0);
              }
              if ((double)piVar22 <= (double)piVar24) {
                piVar24 = piVar22;
              }
            }
            uVar14 = *local_d8;
            if (local_e0 <= (int)uVar14) {
              lVar9 = -1;
              do {
                uVar23 = (ulong)q[local_e0 + lVar9];
                d__[uVar23 - 1] = -1.0;
                *(undefined4 *)((long)pdVar18 + uVar23 * 4) = 0;
                lVar9 = lVar9 + 1;
              } while (uVar14 - local_e0 != (int)lVar9);
            }
            if (local_e4 < local_e0) {
              lVar9 = (long)local_e4;
              do {
                uVar23 = (ulong)q[lVar9 + -1];
                d__[uVar23 - 1] = -1.0;
                lVar9 = lVar9 + 1;
              } while (local_e0 != lVar9);
            }
            if (0 < (int)local_e8) {
              uVar6 = 0;
              do {
                uVar23 = (ulong)q[uVar6];
                d__[uVar23 - 1] = -1.0;
                *(undefined4 *)((long)pdVar18 + uVar23 * 4) = 0;
                uVar6 = uVar6 + 1;
              } while (local_e8 != uVar6);
            }
            local_ec = (uint)uVar23;
            local_dc = (uint)local_d0;
            uVar6 = local_40;
            piVar10 = (int_t *)local_60;
            pdVar13 = local_98;
            piVar22 = local_90;
            piVar20 = local_78;
          }
          piVar10 = (int_t *)((long)piVar10 + 1);
        } while (piVar10 != (int_t *)uVar6);
      }
      uVar14 = *local_d8;
      if (*num != uVar14) {
        if (0 < (int)uVar14) {
          memset(jperm,0,(ulong)uVar14 << 2);
          iperm = local_b8;
        }
        uVar14 = *local_d8;
        if (0 < (int)uVar14) {
          iVar8 = 0;
          lVar9 = 1;
          do {
            iVar15 = iVar8 + 1;
            iVar7 = iperm[lVar9 + -1];
            piVar24 = piVar20;
            if (iperm[lVar9 + -1] == 0) {
              iVar8 = iVar15;
              iVar7 = iVar15;
              piVar24 = piVar22;
            }
            piVar24[iVar7] = (int_t)lVar9;
            lVar9 = lVar9 + 1;
          } while ((ulong)uVar14 + 1 != lVar9);
        }
        uVar14 = *local_d8;
        if (0 < (int)uVar14) {
          iVar8 = 0;
          lVar9 = 1;
          do {
            if (jperm[lVar9 + -1] == 0) {
              lVar16 = (long)iVar8;
              iVar8 = iVar8 + 1;
              iperm[(long)piVar22[lVar16 + 1] + -1] = (int)lVar9;
            }
            lVar9 = lVar9 + 1;
          } while ((ulong)uVar14 + 1 != lVar9);
        }
      }
    }
  }
  return 0;
}

Assistant:

int_t mc64bd_(int_t *n, int_t *ne, int_t *ip, int_t *
	irn, double *a, int *iperm, int_t *num, int_t *jperm, 
	int_t *pr, int_t *q, int_t *l, double *d__)
{
    /* System generated locals */
    int_t i__1, i__2, i__3;
    double d__1, d__2, d__3;
    int_t c__1 = 1;

    /* Local variables */
    int_t i__, j, k;
    double a0;
    int_t i0, q0;
    double ai, di;
    int_t ii, jj, kk;
    double bv;
    int_t up;
    double dq0;
    int_t kk1, kk2;
    double csp;
    int_t isp, jsp, low;
    double dnew;
    int_t jord, qlen, idum, jdum;
    double rinf;
    extern /* Subroutine */ int_t
	mc64dd_(int_t *, int_t *, int_t *, double *, int_t *, int_t *),
	mc64ed_(int_t *, int_t *, int_t *, double *, int_t *, int_t *),
	mc64fd_(int_t *, int_t *, int_t *, int_t *, double *, int_t *, int_t *);


/* *** Copyright (c) 1999  Council for the Central Laboratory of the */
/*     Research Councils                                             *** */
/* *** Although every effort has been made to ensure robustness and  *** */
/* *** reliability of the subroutines in this MC64 suite, we         *** */
/* *** disclaim any liability arising through the use or misuse of   *** */
/* *** any of the subroutines.                                       *** */
/* *** Any problems?   Contact ... */
/*     Iain Duff (I.Duff@rl.ac.uk) or Jacko Koster (jak@ii.uib.no)   *** */

/* N, NE, IP, IRN are described in MC64A/AD. */
/* A is a REAL (DOUBLE PRECISION in the D-version) array of length */
/*   NE. A(K), K=1..NE, must be set to the value of the entry */
/*   that corresponds to IRN(K). It is not altered. */
/* IPERM is an INT_T array of length N. On exit, it contains the */
/*    matching: IPERM(I) = 0 or row I is matched to column IPERM(I). */
/* NUM is INT_T variable. On exit, it contains the cardinality of the */
/*    matching stored in IPERM. */
/* IW is an INT_T work array of length 4N. */
/* DW is a REAL (DOUBLE PRECISION in D-version) work array of length N. */
/* Local variables */
/* Local parameters */
/* Intrinsic functions */
/* External subroutines and/or functions */
/*      EXTERNAL FD05AD,MC64DD,MC64ED,MC64FD, DMACH */
/*      DOUBLE PRECISION FD05AD, DMACH */
/* Set RINF to largest positive real number */
/* XSL  RINF = FD05AD(5) */
    /* Parameter adjustments */
    --d__;
    --l;
    --q;
    --pr;
    --jperm;
    --iperm;
    --ip;
    --a;
    --irn;

    /* Function Body */
    rinf = dmach("Overflow");
/* Initialization */
    *num = 0;
    bv = rinf;
    i__1 = *n;
    for (k = 1; k <= i__1; ++k) {
	iperm[k] = 0;
	jperm[k] = 0;
	pr[k] = ip[k];
	d__[k] = 0.;
/* L10: */
    }
/* Scan columns of matrix; */
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	a0 = -1.;
	i__2 = ip[j + 1] - 1;
	for (k = ip[j]; k <= i__2; ++k) {
	    i__ = irn[k];
	    ai = (d__1 = a[k], abs(d__1));
	    if (ai > d__[i__]) {
		d__[i__] = ai;
	    }
	    if (jperm[j] != 0) {
		goto L30;
	    }
	    if (ai >= bv) {
		a0 = bv;
		if (iperm[i__] != 0) {
		    goto L30;
		}
		jperm[j] = i__;
		iperm[i__] = j;
		++(*num);
	    } else {
		if (ai <= a0) {
		    goto L30;
		}
		a0 = ai;
		i0 = i__;
	    }
L30:
	    ;
	}
	if (a0 != -1. && a0 < bv) {
	    bv = a0;
	    if (iperm[i0] != 0) {
		goto L20;
	    }
	    iperm[i0] = j;
	    jperm[j] = i0;
	    ++(*num);
	}
L20:
	;
    }
/* Update BV with smallest of all the largest maximum absolute values */
/* of the rows. */
    i__1 = *n;
    for (i__ = 1; i__ <= i__1; ++i__) {
/* Computing MIN */
	d__1 = bv, d__2 = d__[i__];
	bv = min(d__1,d__2);
/* L25: */
    }
    if (*num == *n) {
	goto L1000;
    }
/* Rescan unassigned columns; improve initial assignment */
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	if (jperm[j] != 0) {
	    goto L95;
	}
	i__2 = ip[j + 1] - 1;
	for (k = ip[j]; k <= i__2; ++k) {
	    i__ = irn[k];
	    ai = (d__1 = a[k], abs(d__1));
	    if (ai < bv) {
		goto L50;
	    }
	    if (iperm[i__] == 0) {
		goto L90;
	    }
	    jj = iperm[i__];
	    kk1 = pr[jj];
	    kk2 = ip[jj + 1] - 1;
	    if (kk1 > kk2) {
		goto L50;
	    }
	    i__3 = kk2;
	    for (kk = kk1; kk <= i__3; ++kk) {
		ii = irn[kk];
		if (iperm[ii] != 0) {
		    goto L70;
		}
		if ((d__1 = a[kk], abs(d__1)) >= bv) {
		    goto L80;
		}
L70:
		;
	    }
	    pr[jj] = kk2 + 1;
L50:
	    ;
	}
	goto L95;
L80:
	jperm[jj] = ii;
	iperm[ii] = jj;
	pr[jj] = kk + 1;
L90:
	++(*num);
	jperm[j] = i__;
	iperm[i__] = j;
	pr[j] = k + 1;
L95:
	;
    }
    if (*num == *n) {
	goto L1000;
    }
/* Prepare for main loop */
    i__1 = *n;
    for (i__ = 1; i__ <= i__1; ++i__) {
	d__[i__] = -1.;
	l[i__] = 0;
/* L99: */
    }
/* Main loop ... each pass round this loop is similar to Dijkstra's */
/* algorithm for solving the single source shortest path problem */
    i__1 = *n;
    for (jord = 1; jord <= i__1; ++jord) {
	if (jperm[jord] != 0) {
	    goto L100;
	}
	qlen = 0;
	low = *n + 1;
	up = *n + 1;
/* CSP is cost of shortest path to any unassigned row */
/* ISP is matrix position of unassigned row element in shortest path */
/* JSP is column index of unassigned row element in shortest path */
	csp = -1.;
/* Build shortest path tree starting from unassigned column JORD */
	j = jord;
	pr[j] = -1;
/* Scan column J */
	i__2 = ip[j + 1] - 1;
	for (k = ip[j]; k <= i__2; ++k) {
	    i__ = irn[k];
	    dnew = (d__1 = a[k], abs(d__1));
	    if (csp >= dnew) {
		goto L115;
	    }
	    if (iperm[i__] == 0) {
/* Row I is unassigned; update shortest path info */
		csp = dnew;
		isp = i__;
		jsp = j;
		if (csp >= bv) {
		    goto L160;
		}
	    } else {
		d__[i__] = dnew;
		if (dnew >= bv) {
/* Add row I to Q2 */
		    --low;
		    q[low] = i__;
		} else {
/* Add row I to Q, and push it */
		    ++qlen;
		    l[i__] = qlen;
		    mc64dd_(&i__, n, &q[1], &d__[1], &l[1], &c__1);
		}
		jj = iperm[i__];
		pr[jj] = j;
	    }
L115:
	    ;
	}
	i__2 = *num;
	for (jdum = 1; jdum <= i__2; ++jdum) {
/* If Q2 is empty, extract new rows from Q */
	    if (low == up) {
		if (qlen == 0) {
		    goto L160;
		}
		i__ = q[1];
		if (csp >= d__[i__]) {
		    goto L160;
		}
		bv = d__[i__];
		i__3 = *n;
		for (idum = 1; idum <= i__3; ++idum) {
		    mc64ed_(&qlen, n, &q[1], &d__[1], &l[1], &c__1);
		    l[i__] = 0;
		    --low;
		    q[low] = i__;
		    if (qlen == 0) {
			goto L153;
		    }
		    i__ = q[1];
		    if (d__[i__] != bv) {
			goto L153;
		    }
/* L152: */
		}
/* End of dummy loop; this point is never reached */
	    }
/* Move row Q0 */
L153:
	    --up;
	    q0 = q[up];
	    dq0 = d__[q0];
	    l[q0] = up;
/* Scan column that matches with row Q0 */
	    j = iperm[q0];
	    i__3 = ip[j + 1] - 1;
	    for (k = ip[j]; k <= i__3; ++k) {
		i__ = irn[k];
/* Update D(I) */
		if (l[i__] >= up) {
		    goto L155;
		}
/* Computing MIN */
		d__2 = dq0, d__3 = (d__1 = a[k], abs(d__1));
		dnew = min(d__2,d__3);
		if (csp >= dnew) {
		    goto L155;
		}
		if (iperm[i__] == 0) {
/* Row I is unassigned; update shortest path info */
		    csp = dnew;
		    isp = i__;
		    jsp = j;
		    if (csp >= bv) {
			goto L160;
		    }
		} else {
		    di = d__[i__];
		    if (di >= bv || di >= dnew) {
			goto L155;
		    }
		    d__[i__] = dnew;
		    if (dnew >= bv) {
/* Delete row I from Q (if necessary); add row I to Q2 */
			if (di != -1.) {
			    mc64fd_(&l[i__], &qlen, n, &q[1], &d__[1], &l[1], 
				    &c__1);
			}
			l[i__] = 0;
			--low;
			q[low] = i__;
		    } else {
/* Add row I to Q (if necessary); push row I up Q */
			if (di == -1.) {
			    ++qlen;
			    l[i__] = qlen;
			}
			mc64dd_(&i__, n, &q[1], &d__[1], &l[1], &c__1);
		    }
/* Update tree */
		    jj = iperm[i__];
		    pr[jj] = j;
		}
L155:
		;
	    }
/* L150: */
	}
/* If CSP = MINONE, no augmenting path is found */
L160:
	if (csp == -1.) {
	    goto L190;
	}
/* Update bottleneck value */
	bv = min(bv,csp);
/* Find augmenting path by tracing backward in PR; update IPERM,JPERM */
	++(*num);
	i__ = isp;
	j = jsp;
	i__2 = *num + 1;
	for (jdum = 1; jdum <= i__2; ++jdum) {
	    i0 = jperm[j];
	    jperm[j] = i__;
	    iperm[i__] = j;
	    j = pr[j];
	    if (j == -1) {
		goto L190;
	    }
	    i__ = i0;
/* L170: */
	}
/* End of dummy loop; this point is never reached */
L190:
	i__2 = *n;
	for (kk = up; kk <= i__2; ++kk) {
	    i__ = q[kk];
	    d__[i__] = -1.;
	    l[i__] = 0;
/* L191: */
	}
	i__2 = up - 1;
	for (kk = low; kk <= i__2; ++kk) {
	    i__ = q[kk];
	    d__[i__] = -1.;
/* L192: */
	}
	i__2 = qlen;
	for (kk = 1; kk <= i__2; ++kk) {
	    i__ = q[kk];
	    d__[i__] = -1.;
	    l[i__] = 0;
/* L193: */
	}
L100:
	;
    }
/* End of main loop */
/* BV is bottleneck value of final matching */
    if (*num == *n) {
	goto L1000;
    }
/* Matrix is structurally singular, complete IPERM. */
/* JPERM, PR are work arrays */
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	jperm[j] = 0;
/* L300: */
    }
    k = 0;
    i__1 = *n;
    for (i__ = 1; i__ <= i__1; ++i__) {
	if (iperm[i__] == 0) {
	    ++k;
	    pr[k] = i__;
	} else {
	    j = iperm[i__];
	    jperm[j] = i__;
	}
/* L310: */
    }
    k = 0;
    i__1 = *n;
    for (i__ = 1; i__ <= i__1; ++i__) {
	if (jperm[i__] != 0) {
	    goto L320;
	}
	++k;
	jdum = pr[k];
	iperm[jdum] = i__;
L320:
	;
    }
L1000:
    return 0;
}